

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

CharacterNode * __thiscall
icu_63::TextTrieMap::addChildNode
          (TextTrieMap *this,CharacterNode *parent,UChar c,UErrorCode *status)

{
  CharacterNode *pCVar1;
  ushort uVar2;
  int iVar3;
  UBool UVar4;
  int iVar5;
  uint16_t *puVar6;
  uint16_t uVar7;
  ulong uVar8;
  CharacterNode *pCVar9;
  ushort uVar10;
  
  if (U_ZERO_ERROR < *status) {
    return (CharacterNode *)0x0;
  }
  pCVar9 = this->fNodes;
  puVar6 = &parent->fFirstChild;
  uVar10 = 0;
  while (uVar2 = *puVar6, uVar2 != 0) {
    if (pCVar9[uVar2].fCharacter == c) {
      return pCVar9 + uVar2;
    }
    if ((ushort)c < (ushort)pCVar9[uVar2].fCharacter) break;
    uVar10 = uVar2;
    puVar6 = &pCVar9[uVar2].fNextSibling;
  }
  iVar5 = this->fNodesCount;
  if (iVar5 == this->fNodesCapacity) {
    UVar4 = growNodes(this);
    if (UVar4 == '\0') {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return (CharacterNode *)0x0;
    }
    uVar8 = (long)parent - (long)pCVar9;
    pCVar9 = this->fNodes;
    parent = pCVar9 + (int)(uVar8 >> 4);
    iVar5 = this->fNodesCount;
  }
  pCVar1 = pCVar9 + iVar5;
  pCVar1->fValues = (void *)0x0;
  pCVar1->fCharacter = L'\0';
  pCVar1->fFirstChild = 0;
  pCVar1->fNextSibling = 0;
  pCVar1->fHasValuesVector = '\0';
  pCVar1->fPadding = '\0';
  pCVar9[iVar5].fCharacter = c;
  pCVar9[iVar5].fNextSibling = uVar2;
  iVar3 = this->fNodesCount;
  uVar7 = (uint16_t)iVar3;
  if (uVar10 == 0) {
    parent->fFirstChild = uVar7;
  }
  else {
    this->fNodes[uVar10].fNextSibling = uVar7;
  }
  this->fNodesCount = iVar3 + 1;
  return pCVar9 + iVar5;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }